

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotDiff.cpp
# Opt level: O1

void __thiscall OpenMD::PotDiff::writeDiff(PotDiff *this)

{
  double dVar1;
  size_t sVar2;
  char cVar3;
  ostream *poVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ofstream ofs;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream
            (&local_230,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_bin);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    snprintf(painCave.errMsg,2000,"PotDiff: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    dVar1 = (this->data_).Avg_;
    dVar8 = (this->data_).Avg2_ - dVar1 * dVar1;
    dVar7 = 0.0;
    if (0.0 <= dVar8) {
      dVar7 = dVar8;
    }
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    dVar8 = (this->data_).Avg_;
    dVar9 = (this->data_).Avg2_ - dVar8 * dVar8;
    dVar8 = 0.0;
    if (0.0 <= dVar9) {
      dVar8 = dVar9;
    }
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    sVar2 = (this->data_).Count_;
    dVar9 = ((double)CONCAT44(0x45300000,(int)(sVar2 >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#potDiff\n",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#selection: (",0xd);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->selectionScript_)._M_dataplus._M_p,
                        (this->selectionScript_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# <diff> = ",0xb);
    poVar4 = std::ostream::_M_insert<double>(dVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# StdDev = ",0xb);
    poVar4 = std::ostream::_M_insert<double>(dVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# 95% confidence interval = ",0x1c);
    poVar4 = std::ostream::_M_insert<double>((dVar8 * 1.96) / dVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# t\tdiff[t]\n",0xc);
    if ((this->diff_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->diff_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar5 = 1;
      uVar6 = 0;
      do {
        poVar4 = std::ostream::_M_insert<double>
                           ((this->times_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar6]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        poVar4 = std::ostream::_M_insert<double>
                           ((this->diff_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar6]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        uVar6 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar6 < (ulong)((long)(this->diff_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(this->diff_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 3));
    }
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void PotDiff::writeDiff() {
    std::ofstream ofs(outputFilename_.c_str(), std::ios::binary);
    if (ofs.is_open()) {
      RealType mu    = data_.getAverage();
      RealType sigma = data_.getStdDev();
      RealType m95   = data_.get95percentConfidenceInterval();

      ofs << "#potDiff\n";
      ofs << "#selection: (" << selectionScript_ << ")\n";
      ofs << "# <diff> = " << mu << "\n";
      ofs << "# StdDev = " << sigma << "\n";
      ofs << "# 95% confidence interval = " << m95 << "\n";
      ofs << "# t\tdiff[t]\n";
      for (unsigned int i = 0; i < diff_.size(); ++i) {
        ofs << times_[i] << "\t" << diff_[i] << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "PotDiff: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    ofs.close();
  }